

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::ListBuilder::asText(Builder *__return_storage_ptr__,ListBuilder *this)

{
  uint uVar1;
  bool bVar2;
  Fault local_48;
  Fault f_2;
  char *cptr;
  Fault f_1;
  size_t size;
  Fault local_18;
  Fault f;
  ListBuilder *this_local;
  
  bVar2 = false;
  if (this->structDataSize == 8) {
    bVar2 = this->structPointerCount == 0;
  }
  f.exception = (Exception *)this;
  if (bVar2) {
    uVar1 = unbound<unsigned_int>(this->elementCount);
    f_1.exception = (Exception *)(ulong)uVar1;
    if (f_1.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                ((Fault *)&cptr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xbc9,FAILED,"size > 0","\"Message contains text that is not NUL-terminated.\"",
                 (char (*) [50])"Message contains text that is not NUL-terminated.");
      Text::Builder::Builder(__return_storage_ptr__);
      kj::_::Debug::Fault::~Fault((Fault *)&cptr);
    }
    else {
      f_2.exception = (Exception *)this->ptr;
      f_1.exception = (Exception *)&f_1.exception[-1].field_0x157;
      if (*(char *)((long)f_1.exception + (long)((f_2.exception)->trace + -10)) == '\0') {
        Text::Builder::Builder(__return_storage_ptr__,(char *)f_2.exception,(size_t)f_1.exception);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xbd0,FAILED,"cptr[size] == \'\\0\'",
                   "\"Message contains text that is not NUL-terminated.\"",
                   (char (*) [50])"Message contains text that is not NUL-terminated.");
        Text::Builder::Builder(__return_storage_ptr__);
        kj::_::Debug::Fault::~Fault(&local_48);
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xbc3,FAILED,
               "structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS",
               "\"Expected Text, got list of non-bytes.\"",
               (char (*) [38])"Expected Text, got list of non-bytes.");
    Text::Builder::Builder(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder ListBuilder::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Builder();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  char* cptr = reinterpret_cast<char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  return Text::Builder(cptr, size);
}